

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 roundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,uint64_t zSig2,
                   float_status *status)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  float128 fVar5;
  
  uVar3 = (ulong)(uint)zExp;
  bVar1 = status->float_rounding_mode;
  switch((ulong)bVar1) {
  case 0:
  case 4:
    bVar2 = (byte)(zSig2 >> 0x3f);
    goto LAB_00cfb170;
  case 1:
    bVar4 = zSign != '\0';
    break;
  case 2:
    bVar4 = zSign == '\0';
    break;
  case 3:
    bVar2 = 0;
    goto LAB_00cfb170;
  case 5:
    bVar4 = (zSig1 & 1) == 0;
    break;
  default:
    abort();
  }
  bVar2 = zSig2 != 0 & bVar4;
LAB_00cfb170:
  if (0x7ffc < (uint)zExp) {
    if (0x7ffd < zExp) {
LAB_00cfb17a:
      status->float_exception_flags = status->float_exception_flags | 0x28;
      if ((((bVar1 == 3) || (zSign != '\0' && bVar1 == 2)) || (bVar1 == 5)) ||
         (bVar1 == 1 && zSign == '\0')) {
        uVar3 = (ulong)zSign << 0x3f | 0x7ffeffffffffffff;
        zSig1 = 0xffffffffffffffff;
      }
      else {
        uVar3 = (ulong)zSign << 0x3f | 0x7fff000000000000;
        zSig1 = 0;
      }
      goto LAB_00cfb234;
    }
    if (zExp == 0x7ffd) {
      uVar3 = 0x7ffd;
      if (((zSig0 == 0x1ffffffffffff) && (zSig1 == 0xffffffffffffffff)) && (bVar2 != 0))
      goto LAB_00cfb17a;
    }
    else if (zExp < 0) {
      if (status->flush_to_zero == '\0') {
        if (((zExp == -1) && (status->float_detect_tininess != '\x01')) && (bVar2 != 0)) {
          bVar4 = zSig1 != 0xffffffffffffffff && zSig0 == 0x1ffffffffffff || zSig0 < 0x1ffffffffffff
          ;
          bVar2 = 0x3f;
        }
        else {
          bVar2 = (byte)zExp & 0x3f;
          bVar4 = true;
          if (0x3f < (uint)-zExp) {
            if (zExp != -0x40) {
              zSig2 = zSig2 | zSig1;
              if ((uint)-zExp < 0x80) {
                zSig1 = zSig0 << bVar2;
              }
              else {
                zSig1 = (ulong)(zSig0 != 0);
                if (zExp == -0x80) {
                  zSig1 = zSig0;
                }
              }
            }
            goto LAB_00cfb2f6;
          }
        }
        zSig1 = zSig1 << bVar2;
LAB_00cfb2f6:
        if ((bVar4) && (zSig2 != 0 || zSig1 != 0)) {
          status->float_exception_flags = status->float_exception_flags | 0x10;
        }
        fVar5 = (float128)
                (*(code *)(&DAT_00dc6898 + *(int *)(&DAT_00dc6898 + (ulong)bVar1 * 4)))
                          (zSign,0,&DAT_00dc6898,
                           &DAT_00dc6898 + *(int *)(&DAT_00dc6898 + (ulong)bVar1 * 4));
        return fVar5;
      }
      status->float_exception_flags = status->float_exception_flags | 0x80;
      uVar3 = (ulong)zSign << 0x3f;
      zSig1 = 0;
      goto LAB_00cfb234;
    }
  }
  if (zSig2 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (bVar2 == 0) {
    if (zSig1 == 0 && zSig0 == 0) {
      uVar3 = 0;
    }
  }
  else {
    zSig0 = zSig0 + (0xfffffffffffffffe < zSig1);
    zSig1 = zSig1 + 1 & ~(ulong)((zSig2 & 0x7fffffffffffffff) == 0 && bVar1 == 0);
  }
  uVar3 = (uVar3 << 0x30) + ((ulong)zSign << 0x3f) + zSig0;
LAB_00cfb234:
  fVar5.high = uVar3;
  fVar5.low = zSig1;
  return fVar5;
}

Assistant:

static float128 roundAndPackFloat128(flag zSign, int32_t zExp,
                                     uint64_t zSig0, uint64_t zSig1,
                                     uint64_t zSig2, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig2 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig2;
        break;
    case float_round_down:
        increment = zSign && zSig2;
        break;
    case float_round_to_odd:
        increment = !(zSig1 & 0x1) && zSig2;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) zExp ) {
        if (    ( 0x7FFD < zExp )
             || (    ( zExp == 0x7FFD )
                  && eq128(
                         UINT64_C(0x0001FFFFFFFFFFFF),
                         UINT64_C(0xFFFFFFFFFFFFFFFF),
                         zSig0,
                         zSig1
                     )
                  && increment
                )
           ) {
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
                 || (roundingMode == float_round_to_odd)
               ) {
                return
                    packFloat128(
                        zSign,
                        0x7FFE,
                        UINT64_C(0x0000FFFFFFFFFFFF),
                        UINT64_C(0xFFFFFFFFFFFFFFFF)
                    );
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat128(zSign, 0, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ! increment
                || lt128(
                       zSig0,
                       zSig1,
                       UINT64_C(0x0001FFFFFFFFFFFF),
                       UINT64_C(0xFFFFFFFFFFFFFFFF)
                   );
            shift128ExtraRightJamming(
                zSig0, zSig1, zSig2, - zExp, &zSig0, &zSig1, &zSig2 );
            zExp = 0;
            if (isTiny && zSig2) {
                float_raise(float_flag_underflow, status);
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig2 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig2;
                break;
            case float_round_down:
                increment = zSign && zSig2;
                break;
            case float_round_to_odd:
                increment = !(zSig1 & 0x1) && zSig2;
                break;
            default:
                abort();
            }
        }
    }
    if (zSig2) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        add128( zSig0, zSig1, 0, 1, &zSig0, &zSig1 );
        zSig1 &= ~ ( ( zSig2 + zSig2 == 0 ) & roundNearestEven );
    }
    else {
        if ( ( zSig0 | zSig1 ) == 0 ) zExp = 0;
    }
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}